

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableReaderFields(SwiftGenerator *this,FieldDef *field)

{
  IdlNamer *this_00;
  Value *type_00;
  CodeWriter *this_01;
  BaseType BVar1;
  EnumDef *pEVar2;
  char *pcVar3;
  char *__s;
  string *psVar4;
  bool bVar5;
  string default_value;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  string is_required;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> required_reader;
  string local_330;
  string def_Val;
  string local_2f0;
  string local_2d0;
  string optional;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> const_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string type;
  string field_field;
  string offset;
  
  NumToString<unsigned_short>(&offset,(field->value).offset);
  this_00 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&field_field,this_00,field);
  type_00 = &field->value;
  GenType_abi_cxx11_(&type,this,&type_00->type,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&default_value,"FIELDVAR",(allocator<char> *)&optional);
  (*(this_00->super_Namer)._vptr_Namer[7])(&def_Val,this_00,field);
  this_01 = &this->code_;
  CodeWriter::SetValue(this_01,&default_value,&def_Val);
  std::__cxx11::string::~string((string *)&def_Val);
  std::__cxx11::string::~string((string *)&default_value);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&default_value,"FIELDMETHOD",(allocator<char> *)&optional);
  (*(this_00->super_Namer)._vptr_Namer[4])(&def_Val,this_00,field);
  CodeWriter::SetValue(this_01,&default_value,&def_Val);
  std::__cxx11::string::~string((string *)&def_Val);
  std::__cxx11::string::~string((string *)&default_value);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&default_value,"VALUETYPE",(allocator<char> *)&def_Val);
  CodeWriter::SetValue(this_01,&default_value,&type);
  std::__cxx11::string::~string((string *)&default_value);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&default_value,"OFFSET",(allocator<char> *)&optional);
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&def_Val,this_00,field,(ulong)(this->namer_).super_Namer.config_.constants);
  CodeWriter::SetValue(this_01,&default_value,&def_Val);
  std::__cxx11::string::~string((string *)&def_Val);
  std::__cxx11::string::~string((string *)&default_value);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&default_value,"CONSTANT",(allocator<char> *)&optional);
  SwiftConstant_abi_cxx11_(&def_Val,this,field);
  CodeWriter::SetValue(this_01,&default_value,&def_Val);
  std::__cxx11::string::~string((string *)&def_Val);
  std::__cxx11::string::~string((string *)&default_value);
  if (field->presence == kOptional) {
    bVar5 = (type_00->type).base_type - BASE_TYPE_UTYPE < 0xc;
    __s = "{{CONSTANT}}";
    if (bVar5) {
      __s = "nil";
    }
    pcVar3 = "";
    if (bVar5) {
      pcVar3 = "?";
    }
  }
  else {
    __s = "{{CONSTANT}}";
    pcVar3 = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&def_Val,__s,(allocator<char> *)&default_value);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&optional,pcVar3,(allocator<char> *)&default_value);
  std::operator+(&default_value,"return o == 0 ? ",&def_Val);
  std::operator+(&const_string,&default_value," : ");
  std::__cxx11::string::~string((string *)&default_value);
  GenComment(this,&(field->super_Definition).doc_comment);
  BVar1 = (type_00->type).base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
    if ((BVar1 - BASE_TYPE_UTYPE < 10) && ((field->value).type.enum_def != (EnumDef *)0x0)) {
      if (BVar1 == BASE_TYPE_BOOL) {
LAB_0021b515:
        if (field->presence == kOptional) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&default_value,"nil",(allocator<char> *)&is_required);
        }
        else {
          SwiftConstant_abi_cxx11_(&default_value,this,field);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&is_required,"CONSTANT",(allocator<char> *)&required_reader);
        CodeWriter::SetValue(this_01,&is_required,&default_value);
        std::__cxx11::string::~string((string *)&is_required);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&is_required,"VALUETYPE",(allocator<char> *)&local_3d8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&required_reader,"Bool",(allocator<char> *)&local_3b0);
        CodeWriter::SetValue(this_01,&is_required,&required_reader);
        std::__cxx11::string::~string((string *)&required_reader);
        std::__cxx11::string::~string((string *)&is_required);
        GenReaderMainBody(&is_required,this,&optional);
        std::operator+(&local_f0,&is_required,"\\");
        CodeWriter::operator+=(this_01,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&is_required);
        GenOffset_abi_cxx11_(&local_3d8,this);
        std::operator+(&required_reader,&local_3d8,"return o == 0 ? {{CONSTANT}} : ");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_370,"VALUETYPE",(allocator<char> *)&local_2f0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,"o",(allocator<char> *)&local_2d0);
        GenReader(&local_3b0,this,&local_370,&local_330);
        std::operator+(&is_required,&required_reader,&local_3b0);
        std::operator+(&local_110,&is_required," }");
        CodeWriter::operator+=(this_01,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&is_required);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&required_reader);
        std::__cxx11::string::~string((string *)&local_3d8);
        if ((((this->super_BaseGenerator).parser_)->opts).mutable_buffer == true) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&is_required,"o",(allocator<char> *)&local_3d8);
          GenOffset_abi_cxx11_(&required_reader,this);
          GenMutate(&local_130,this,&is_required,&required_reader,false);
          CodeWriter::operator+=(this_01,&local_130);
          psVar4 = &local_130;
          goto LAB_0021c1f6;
        }
      }
      else {
        if (field->presence == kOptional) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&default_value,"nil",(allocator<char> *)&is_required);
        }
        else {
          GenEnumDefaultValue_abi_cxx11_(&default_value,this,field);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&is_required,"BASEVALUE",(allocator<char> *)&local_3d8);
        GenTypeBasic_abi_cxx11_(&required_reader,this,&type_00->type,false);
        CodeWriter::SetValue(this_01,&is_required,&required_reader);
        std::__cxx11::string::~string((string *)&required_reader);
        std::__cxx11::string::~string((string *)&is_required);
        GenReaderMainBody(&is_required,this,&optional);
        std::operator+(&local_150,&is_required,"\\");
        CodeWriter::operator+=(this_01,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&is_required);
        GenOffset_abi_cxx11_(&local_2f0,this);
        std::operator+(&local_330,&local_2f0,"return o == 0 ? ");
        std::operator+(&local_370,&local_330,&default_value);
        std::operator+(&local_3b0,&local_370," : ");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"o",&local_3b1);
        GenEnumConstructor(&local_2d0,this,&local_290);
        std::operator+(&local_3d8,&local_3b0,&local_2d0);
        std::operator+(&required_reader,&local_3d8,"?? ");
        std::operator+(&is_required,&required_reader,&default_value);
        std::operator+(&local_170,&is_required," }");
        CodeWriter::operator+=(this_01,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&is_required);
        std::__cxx11::string::~string((string *)&required_reader);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_2f0);
        if (((((this->super_BaseGenerator).parser_)->opts).mutable_buffer == true) &&
           ((pEVar2 = (field->value).type.enum_def, pEVar2 == (EnumDef *)0x0 ||
            (pEVar2->is_union == false)))) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&is_required,"o",(allocator<char> *)&local_3d8);
          GenOffset_abi_cxx11_(&required_reader,this);
          GenMutate(&local_190,this,&is_required,&required_reader,true);
          CodeWriter::operator+=(this_01,&local_190);
          psVar4 = &local_190;
LAB_0021c1f6:
          std::__cxx11::string::~string((string *)psVar4);
          psVar4 = &required_reader;
          goto LAB_0021c203;
        }
      }
    }
    else {
      if (BVar1 == BASE_TYPE_BOOL) goto LAB_0021b515;
      GenReaderMainBody(&local_3d8,this,&optional);
      GenOffset_abi_cxx11_(&local_3b0,this);
      std::operator+(&required_reader,&local_3d8,&local_3b0);
      std::operator+(&is_required,&required_reader,&const_string);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"VALUETYPE",(allocator<char> *)&local_2d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"o",(allocator<char> *)&local_290);
      GenReader(&local_370,this,&local_330,&local_2f0);
      std::operator+(&default_value,&is_required,&local_370);
      std::operator+(&local_b0,&default_value," }");
      CodeWriter::operator+=(this_01,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&default_value);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&is_required);
      std::__cxx11::string::~string((string *)&required_reader);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d8);
      if ((((this->super_BaseGenerator).parser_)->opts).mutable_buffer != true) goto LAB_0021c56b;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_value,"o",(allocator<char> *)&required_reader);
      GenOffset_abi_cxx11_(&is_required,this);
      GenMutate(&local_d0,this,&default_value,&is_required,false);
      CodeWriter::operator+=(this_01,&local_d0);
      psVar4 = &local_d0;
LAB_0021c203:
      std::__cxx11::string::~string((string *)psVar4);
      std::__cxx11::string::~string((string *)&is_required);
    }
    psVar4 = &default_value;
  }
  else {
    pcVar3 = "?";
    if (field->presence == kRequired) {
      pcVar3 = "!";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&is_required,pcVar3,(allocator<char> *)&default_value);
    if (field->presence == kRequired) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&required_reader,"return ",(allocator<char> *)&default_value);
    }
    else {
      std::__cxx11::string::string((string *)&required_reader,(string *)&const_string);
    }
    switch((type_00->type).base_type) {
    case BASE_TYPE_STRING:
      SwiftConstant_abi_cxx11_(&local_3b0,this,field);
      psVar4 = &default_value;
      std::operator+(&local_3d8,"\"",&local_3b0);
      std::operator+(&default_value,&local_3d8,"\"");
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,"VALUETYPE",(allocator<char> *)&local_370);
      GenType_abi_cxx11_(&local_3b0,this,&type_00->type,false);
      CodeWriter::SetValue(this_01,&local_3d8,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,"CONSTANT",(allocator<char> *)&local_370);
      if (field->presence == kDefault) {
        std::__cxx11::string::string((string *)&local_3b0,(string *)&default_value);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b0,"nil",(allocator<char> *)&local_2f0);
      }
      CodeWriter::SetValue(this_01,&local_3d8,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d8);
      GenReaderMainBody(&local_370,this,&is_required);
      GenOffset_abi_cxx11_(&local_330,this);
      std::operator+(&local_3b0,&local_370,&local_330);
      std::operator+(&local_3d8,&local_3b0,&required_reader);
      std::operator+(&local_210,&local_3d8,"{{ACCESS}}.string(at: o) }");
      CodeWriter::operator+=(this_01,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_370);
      std::operator+(&local_3d8,"{{ACCESS_TYPE}} var {{FIELDVAR}}SegmentArray: [UInt8]",&is_required
                    );
      std::operator+(&local_230,&local_3d8,
                     " { return {{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) }");
      CodeWriter::operator+=(this_01,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_3d8);
      break;
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_ARRAY:
      GenTableReaderVectorFields(this,field);
      goto LAB_0021c554;
    case BASE_TYPE_STRUCT:
      if (((field->value).type.struct_def)->fixed != true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&default_value,"VALUETYPE",(allocator<char> *)&local_3b0);
        GenType_abi_cxx11_(&local_3d8,this,&type_00->type,false);
        CodeWriter::SetValue(this_01,&default_value,&local_3d8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&default_value);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&default_value,"CONSTANT",(allocator<char> *)&local_3b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d8,"nil",(allocator<char> *)&local_370);
        CodeWriter::SetValue(this_01,&default_value,&local_3d8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&default_value);
        GenReaderMainBody(&local_370,this,&is_required);
        GenOffset_abi_cxx11_(&local_330,this);
        std::operator+(&local_3b0,&local_370,&local_330);
        std::operator+(&local_3d8,&local_3b0,&required_reader);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_290,"o + {{ACCESS}}.position",&local_3b1);
        std::operator+(&default_value,"{{ACCESS}}.indirect(",&local_290);
        std::operator+(&local_2d0,&default_value,")");
        std::__cxx11::string::~string((string *)&default_value);
        GenConstructor(&local_2f0,this,&local_2d0);
        std::operator+(&local_1f0,&local_3d8,&local_2f0);
        CodeWriter::operator+=(this_01,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3b0);
        psVar4 = &local_330;
        goto LAB_0021c3e8;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_value,"VALUETYPE",(allocator<char> *)&local_3b0);
      GenType_abi_cxx11_(&local_3d8,this,&type_00->type,false);
      CodeWriter::SetValue(this_01,&default_value,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&default_value);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_value,"CONSTANT",(allocator<char> *)&local_3b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,"nil",(allocator<char> *)&local_370);
      CodeWriter::SetValue(this_01,&default_value,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&default_value);
      GenReaderMainBody(&local_3b0,this,&is_required);
      GenOffset_abi_cxx11_(&local_370,this);
      std::operator+(&local_3d8,&local_3b0,&local_370);
      std::operator+(&default_value,&local_3d8,&required_reader);
      std::operator+(&local_1b0,&default_value,
                     "{{ACCESS}}.readBuffer(of: {{VALUETYPE}}.self, at: o) }");
      CodeWriter::operator+=(this_01,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&default_value);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_value,"FIELDVAR",(allocator<char> *)&local_370);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"mutable",(allocator<char> *)&local_330);
      Namer::Variable(&local_3d8,&this_00->super_Namer,&local_3b0,&field_field);
      CodeWriter::SetValue(this_01,&default_value,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&default_value);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_value,"VALUETYPE",(allocator<char> *)&local_330);
      GenType_abi_cxx11_(&local_3b0,this,&type_00->type,false);
      Mutable_abi_cxx11_(&local_370,this);
      std::operator+(&local_3d8,&local_3b0,&local_370);
      CodeWriter::SetValue(this_01,&default_value,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&default_value);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_value,"CONSTANT",(allocator<char> *)&local_3b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,"nil",(allocator<char> *)&local_370);
      CodeWriter::SetValue(this_01,&default_value,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&default_value);
      GenReaderMainBody(&local_3b0,this,&is_required);
      GenOffset_abi_cxx11_(&local_370,this);
      std::operator+(&local_3d8,&local_3b0,&local_370);
      std::operator+(&default_value,&local_3d8,&required_reader);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"o + {{ACCESS}}.position",(allocator<char> *)&local_2d0);
      GenConstructor(&local_330,this,&local_2f0);
      std::operator+(&local_1d0,&default_value,&local_330);
      CodeWriter::operator+=(this_01,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&default_value);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_370);
      psVar4 = &local_3b0;
      break;
    case BASE_TYPE_UNION:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_value,"CONSTANT",(allocator<char> *)&local_3b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,"nil",(allocator<char> *)&local_370);
      CodeWriter::SetValue(this_01,&default_value,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&default_value);
      std::operator+(&local_370,
                     "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: FlatbuffersInitializable>(type: T.Type) -> T"
                     ,&is_required);
      std::operator+(&local_3b0,&local_370," { ");
      GenOffset_abi_cxx11_(&local_330,this);
      std::operator+(&local_3d8,&local_3b0,&local_330);
      std::operator+(&default_value,&local_3d8,&required_reader);
      std::operator+(&local_250,&default_value,"{{ACCESS}}.union(o) }");
      CodeWriter::operator+=(this_01,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&default_value);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_330);
      psVar4 = &local_3b0;
LAB_0021c3e8:
      std::__cxx11::string::~string((string *)psVar4);
      psVar4 = &local_370;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_swift.cpp"
                    ,0x318,
                    "void flatbuffers::swift::SwiftGenerator::GenTableReaderFields(const FieldDef &)"
                   );
    }
    std::__cxx11::string::~string((string *)psVar4);
LAB_0021c554:
    std::__cxx11::string::~string((string *)&required_reader);
    psVar4 = &is_required;
  }
  std::__cxx11::string::~string((string *)psVar4);
LAB_0021c56b:
  std::__cxx11::string::~string((string *)&const_string);
  std::__cxx11::string::~string((string *)&optional);
  std::__cxx11::string::~string((string *)&def_Val);
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&field_field);
  std::__cxx11::string::~string((string *)&offset);
  return;
}

Assistant:

void GenTableReaderFields(const FieldDef &field) {
    const auto offset = NumToString(field.value.offset);
    const auto field_field = namer_.Field(field);
    const auto type = GenType(field.value.type);
    code_.SetValue("FIELDVAR", namer_.Variable(field));
    code_.SetValue("FIELDMETHOD", namer_.Method(field));
    code_.SetValue("VALUETYPE", type);
    code_.SetValue("OFFSET", namer_.Constant(field.name));
    code_.SetValue("CONSTANT", SwiftConstant(field));
    bool opt_scalar =
        field.IsOptional() && IsScalar(field.value.type.base_type);
    std::string def_Val = opt_scalar ? "nil" : "{{CONSTANT}}";
    std::string optional = opt_scalar ? "?" : "";
    const auto const_string = "return o == 0 ? " + def_Val + " : ";
    GenComment(field.doc_comment);
    if (IsScalar(field.value.type.base_type) && !IsEnum(field.value.type) &&
        !IsBool(field.value.type.base_type)) {
      code_ += GenReaderMainBody(optional) + GenOffset() + const_string +
               GenReader("VALUETYPE", "o") + " }";
      if (parser_.opts.mutable_buffer) code_ += GenMutate("o", GenOffset());
      return;
    }

    if (IsBool(field.value.type.base_type)) {
      std::string default_value =
          field.IsOptional() ? "nil" : SwiftConstant(field);
      code_.SetValue("CONSTANT", default_value);
      code_.SetValue("VALUETYPE", "Bool");
      code_ += GenReaderMainBody(optional) + "\\";
      code_ += GenOffset() +
               "return o == 0 ? {{CONSTANT}} : " + GenReader("VALUETYPE", "o") +
               " }";
      if (parser_.opts.mutable_buffer) code_ += GenMutate("o", GenOffset());
      return;
    }

    if (IsEnum(field.value.type)) {
      const auto default_value =
          field.IsOptional() ? "nil" : GenEnumDefaultValue(field);
      code_.SetValue("BASEVALUE", GenTypeBasic(field.value.type, false));
      code_ += GenReaderMainBody(optional) + "\\";
      code_ += GenOffset() + "return o == 0 ? " + default_value + " : " +
               GenEnumConstructor("o") + "?? " + default_value + " }";
      if (parser_.opts.mutable_buffer && !IsUnion(field.value.type))
        code_ += GenMutate("o", GenOffset(), true);
      return;
    }

    const std::string is_required = field.IsRequired() ? "!" : "?";
    const auto required_reader = field.IsRequired() ? "return " : const_string;

    if (IsStruct(field.value.type) && field.value.type.struct_def->fixed) {
      code_.SetValue("VALUETYPE", GenType(field.value.type));
      code_.SetValue("CONSTANT", "nil");
      code_ += GenReaderMainBody(is_required) + GenOffset() + required_reader +
               "{{ACCESS}}.readBuffer(of: {{VALUETYPE}}.self, at: o) }";
      code_.SetValue("FIELDVAR", namer_.Variable("mutable", field_field));
      code_.SetValue("VALUETYPE", GenType(field.value.type) + Mutable());
      code_.SetValue("CONSTANT", "nil");
      code_ += GenReaderMainBody(is_required) + GenOffset() + required_reader +
               GenConstructor("o + {{ACCESS}}.position");
      return;
    }
    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT:
        code_.SetValue("VALUETYPE", GenType(field.value.type));
        code_.SetValue("CONSTANT", "nil");
        code_ += GenReaderMainBody(is_required) + GenOffset() +
                 required_reader +
                 GenConstructor(GenIndirect("o + {{ACCESS}}.position"));
        break;

      case BASE_TYPE_STRING: {
        const auto default_string = "\"" + SwiftConstant(field) + "\"";
        code_.SetValue("VALUETYPE", GenType(field.value.type));
        code_.SetValue("CONSTANT", field.IsDefault() ? default_string : "nil");
        code_ += GenReaderMainBody(is_required) + GenOffset() +
                 required_reader + "{{ACCESS}}.string(at: o) }";
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}SegmentArray: [UInt8]" +
                 is_required +
                 " { return "
                 "{{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) }";
        break;
      }
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_VECTOR: GenTableReaderVectorFields(field); break;
      case BASE_TYPE_UNION:
        code_.SetValue("CONSTANT", "nil");
        code_ +=
            "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: "
            "FlatbuffersInitializable>(type: "
            "T.Type) -> T" +
            is_required + " { " + GenOffset() + required_reader +
            "{{ACCESS}}.union(o) }";
        break;
      default: FLATBUFFERS_ASSERT(0);
    }
  }